

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

uint baryonyx::itm::get_thread_number(context *ctx)

{
  uint local_1c;
  uint ret;
  context *ctx_local;
  
  if ((ctx->parameters).thread < 1) {
    local_1c = std::thread::hardware_concurrency();
  }
  else {
    local_1c = (ctx->parameters).thread;
  }
  if (local_1c == 0) {
    ctx_local._4_4_ = 1;
  }
  else {
    ctx_local._4_4_ = local_1c;
  }
  return ctx_local._4_4_;
}

Assistant:

inline unsigned
get_thread_number(const baryonyx::context& ctx) noexcept
{
    unsigned ret;

    if (ctx.parameters.thread <= 0)
        ret = std::thread::hardware_concurrency();
    else
        ret = static_cast<unsigned>(ctx.parameters.thread);

    if (ret == 0)
        return 1;

    return ret;
}